

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgx_enc.c
# Opt level: O0

int pgx_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  int iVar1;
  int iVar2;
  pgx_enc_t *enc;
  pgx_enc_t encbuf;
  int prec;
  _Bool sgnd;
  uint_fast32_t height;
  uint_fast32_t width;
  pgx_hdr_t hdr;
  char *optstr_local;
  jas_stream_t *out_local;
  jas_image_t *image_local;
  
  hdr.height = (uint_fast32_t)optstr;
  if (image->clrspc_ >> 8 == 3) {
    iVar1 = jas_image_getcmptbytype(image,0);
    if (iVar1 < 0) {
      jas_eprintf("error: missing color component\n");
      image_local._4_4_ = -1;
    }
    else {
      hdr.prec = image->cmpts_[iVar1]->width_;
      hdr.width = image->cmpts_[iVar1]->height_;
      iVar2 = image->cmpts_[iVar1]->prec_;
      hdr.magic._1_1_ = image->cmpts_[iVar1]->sgnd_ != 0;
      if ((image->numcmpts_ < 2) && (iVar2 < 0x11)) {
        width = 0x5047;
        hdr.magic._0_1_ = 1;
        hdr._8_8_ = SEXT48(iVar2);
        iVar2 = jas_getdbglevel();
        if (9 < iVar2) {
          pgx_dumphdr(_stderr,(pgx_hdr_t *)&width);
        }
        iVar2 = pgx_puthdr(out,(pgx_hdr_t *)&width);
        if (iVar2 == 0) {
          iVar1 = pgx_putdata(out,(pgx_hdr_t *)&width,image,iVar1);
          if (iVar1 == 0) {
            image_local._4_4_ = 0;
          }
          else {
            image_local._4_4_ = -1;
          }
        }
        else {
          image_local._4_4_ = -1;
        }
      }
      else {
        jas_eprintf("The PGX format cannot be used to represent an image with this geometry.\n");
        image_local._4_4_ = -1;
      }
    }
  }
  else {
    jas_eprintf("error: PGX format does not support color space\n");
    image_local._4_4_ = -1;
  }
  return image_local._4_4_;
}

Assistant:

int pgx_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	pgx_hdr_t hdr;
	uint_fast32_t width;
	uint_fast32_t height;
	bool sgnd;
	int prec;
	pgx_enc_t encbuf;
	pgx_enc_t *enc = &encbuf;

	/* Avoid compiler warnings about unused parameters. */
	(void)optstr;

	switch (jas_clrspc_fam(jas_image_clrspc(image))) {
	case JAS_CLRSPC_FAM_GRAY:
		if ((enc->cmpt = jas_image_getcmptbytype(image,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y))) < 0) {
			jas_eprintf("error: missing color component\n");
			return -1;
		}
		break;
	default:
		jas_eprintf("error: PGX format does not support color space\n");
		return -1;
		break;
	}

	width = jas_image_cmptwidth(image, enc->cmpt);
	height = jas_image_cmptheight(image, enc->cmpt);
	prec = jas_image_cmptprec(image, enc->cmpt);
	sgnd = jas_image_cmptsgnd(image, enc->cmpt);

	/* The PGX format is quite limited in the set of image geometries
	  that it can handle.  Here, we check to ensure that the image to
	  be saved can actually be represented reasonably accurately using the
	  PGX format. */
	/* There must be exactly one component. */
	if (jas_image_numcmpts(image) > 1 || prec > 16) {
		jas_eprintf("The PGX format cannot be used to represent an image with this geometry.\n");
		return -1;
	}

	hdr.magic = PGX_MAGIC;
	hdr.bigendian = true;
	hdr.sgnd = sgnd;
	hdr.prec = prec;
	hdr.width = width;
	hdr.height = height;

	if (jas_getdbglevel() >= 10) {
		pgx_dumphdr(stderr, &hdr);
	}

	if (pgx_puthdr(out, &hdr)) {
		return -1;
	}

	if (pgx_putdata(out, &hdr, image, enc->cmpt)) {
		return -1;
	}

	return 0;
}